

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,string *toFile,mode_t permissions)

{
  char *__s;
  cmExecutionStatus *pcVar1;
  Status SVar2;
  size_t sVar3;
  ostream *poVar4;
  bool bVar5;
  ostringstream e;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  bVar5 = true;
  if (permissions != 0) {
    SVar2 = cmsys::SystemTools::SetPermissions(toFile,permissions,false);
    if (SVar2.Kind_ != Success) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      __s = this->Name;
      if (__s == (char *)0x0) {
        std::ios::clear((int)(_func_int *)
                             ((long)&local_1b8 + (long)*(_func_int **)(local_198._0_8_ + -0x18)) +
                        0x20);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198," cannot set permissions on \"",0x1c);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(toFile->_M_dataplus)._M_p,toFile->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": ",3);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_1b8,local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      pcVar1 = this->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool cmFileCopier::SetPermissions(const std::string& toFile,
                                  mode_t permissions)
{
  if (permissions) {
#ifdef _WIN32
    if (Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
      // Store the mode in an NTFS alternate stream.
      std::string mode_t_adt_filename = toFile + ":cmake_mode_t";

      // Writing to an NTFS alternate stream changes the modification
      // time, so we need to save and restore its original value.
      cmFileTimes file_time_orig(toFile);
      {
        cmsys::ofstream permissionStream(mode_t_adt_filename.c_str());
        if (permissionStream) {
          permissionStream << std::oct << permissions << std::endl;
        }
        permissionStream.close();
      }
      file_time_orig.Store(toFile);
    }
#endif

    if (!cmSystemTools::SetPermissions(toFile, permissions)) {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile
        << "\": " << cmSystemTools::GetLastSystemError() << ".";
      this->Status.SetError(e.str());
      return false;
    }
  }
  return true;
}